

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAngle.cpp
# Opt level: O0

void test_qclab_QAngle<float>(void)

{
  QAngle<float> *pQVar1;
  float *this;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  __type _Var8;
  double __x;
  double dVar9;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double dVar10;
  double __x_05;
  double __x_06;
  double __x_07;
  double dVar11;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  double __x_17;
  double __x_18;
  double __x_19;
  double __x_20;
  double __x_21;
  double __x_22;
  double __x_23;
  double __x_24;
  double __x_25;
  AssertHelper local_8e8;
  Message local_8e0;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_47;
  Message local_8c0;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_46;
  Message local_8a0;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_45;
  Message local_880;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_44;
  Message local_860;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_43;
  Message local_840;
  undefined1 local_838 [8];
  AssertionResult gtest_ar_42;
  QAngle<float> local_820;
  QAngle<float> angle2_3;
  QAngle<float> angle1_3;
  float sin_7;
  float cos_7;
  float theta_7;
  Message local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_41;
  Message local_7d8;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_40;
  Message local_7b8;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_39;
  QAngle<float> local_798;
  QAngle<float> minus;
  Message local_788;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_38;
  Message local_768;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_37;
  Message local_748;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_36;
  float sin_6;
  float cos_6;
  float theta_6;
  QAngle<float> local_718;
  QAngle<float> sum;
  QAngle<float> angle2_2;
  float sin2_2;
  float cos2_2;
  float theta2_2;
  QAngle<float> angle1_2;
  float sin1_2;
  float cos1_2;
  float theta1_2;
  Message local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_35;
  Message local_6c0;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_34;
  Message local_6a0;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_33;
  Message local_680;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_32;
  Message local_660;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_31;
  Message local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_30;
  float sin_5;
  float cos_5;
  float theta_5;
  QAngle<float> angle2_1;
  float sin2_1;
  float cos2_1;
  float theta2_1;
  QAngle<float> angle1_1;
  float sin1_1;
  float cos1_1;
  float theta1_1;
  Message local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_29;
  Message local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_28;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_27;
  Message local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_26;
  Message local_568;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_25;
  Message local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_24;
  float sin_4;
  float cos_4;
  float theta_4;
  QAngle<float> angle2;
  float sin2;
  float cos2;
  float theta2;
  QAngle<float> angle1;
  float sin1;
  float cos1;
  float theta1;
  Message local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_23;
  Message local_4d0;
  float local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_22;
  Message local_4a8;
  float local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_21;
  QAngle<float> angle_4;
  float sin_3;
  float cos_3;
  float theta_3;
  Message local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_20;
  Message local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_19;
  Message local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_18;
  QAngle<float> angle_3;
  float sin_2;
  float cos_2;
  float theta_2;
  Message local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_17;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_16;
  Message local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_15;
  QAngle<float> angle_2;
  float sin_1;
  float cos_1;
  float theta_1;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_14;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_13;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_12;
  QAngle<float> angle_1;
  float sin;
  float cos;
  float theta;
  AssertHelper local_2e8;
  Message local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_11;
  Message local_1c0;
  float local_1b8;
  float local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_10;
  Message local_198;
  float local_190;
  float local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_9;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_8;
  Message local_150;
  float local_148;
  float local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_7;
  Message local_128;
  float local_120;
  float local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_6;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_5;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  QAngle<float> new_angle;
  Message local_98;
  int local_90;
  float local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  int local_68;
  float local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  int local_30;
  float local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  QAngle<float> angle;
  float tol;
  float pi;
  
  _Var8 = std::atan<int>(1);
  fVar4 = (float)(_Var8 * 4.0);
  std::numeric_limits<float>::epsilon();
  qclab::QAngle<float>::QAngle((QAngle<float> *)&gtest_ar.message_);
  dVar9 = qclab::QAngle<float>::cos((QAngle<float> *)&gtest_ar.message_,__x);
  local_2c = SUB84(dVar9,0);
  local_30 = 1;
  testing::internal::EqHelper::Compare<float,_int,_nullptr>
            ((EqHelper *)local_28,"angle.cos()","1",&local_2c,&local_30);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&gtest_ar.message_,__x_00);
  local_64 = SUB84(dVar9,0);
  local_68 = 0;
  testing::internal::EqHelper::Compare<float,_int,_nullptr>
            ((EqHelper *)local_60,"angle.sin()","0",&local_64,&local_68);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_8c = qclab::QAngle<float>::theta((QAngle<float> *)&gtest_ar.message_);
  local_90 = 0;
  testing::internal::EqHelper::Compare<float,_int,_nullptr>
            ((EqHelper *)local_88,"angle.theta()","0",&local_8c,&local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&new_angle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&new_angle,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&new_angle);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  qclab::QAngle<float>::QAngle((QAngle<float> *)&gtest_ar_3.message_,1.0);
  qclab::QAngle<float>::update
            ((QAngle<float> *)&gtest_ar.message_,(QAngle<float> *)&gtest_ar_3.message_);
  dVar9 = qclab::QAngle<float>::cos((QAngle<float> *)&gtest_ar.message_,__x_01);
  _Var8 = std::cos<int>(1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b8,"angle.cos()","std::cos( 1 )","tol",(double)SUB84(dVar9,0),_Var8,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&gtest_ar.message_,__x_02);
  _Var8 = std::sin<int>(1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d8,"angle.sin()","std::sin( 1 )","tol",(double)SUB84(dVar9,0),_Var8,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  fVar5 = qclab::QAngle<float>::theta((QAngle<float> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f8,"angle.theta()","1","tol",(double)fVar5,1.0,1.1920928955078125e-06
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  qclab::QAngle<float>::update((QAngle<float> *)&gtest_ar.message_,fVar4 * 0.5);
  dVar9 = qclab::QAngle<float>::cos((QAngle<float> *)&gtest_ar.message_,__x_03);
  local_11c = SUB84(dVar9,0);
  dVar9 = std::cos((double)(ulong)(uint)(fVar4 * 0.5));
  local_120 = SUB84(dVar9,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_118,"angle.cos()","std::cos( pi/2 )",&local_11c,&local_120);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&gtest_ar.message_,__x_04);
  local_144 = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)(fVar4 * 0.5));
  local_148 = SUB84(dVar9,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_140,"angle.sin()","std::sin( pi/2 )",&local_144,&local_148);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  fVar5 = qclab::QAngle<float>::theta((QAngle<float> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_168,"angle.theta()","pi/2","tol",(double)fVar5,(double)(fVar4 * 0.5),
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  dVar9 = std::cos((double)(ulong)(uint)(fVar4 / 3.0));
  dVar10 = std::sin((double)(ulong)(uint)(fVar4 / 3.0));
  qclab::QAngle<float>::update((QAngle<float> *)&gtest_ar.message_,SUB84(dVar9,0),SUB84(dVar10,0));
  dVar9 = qclab::QAngle<float>::cos((QAngle<float> *)&gtest_ar.message_,__x_05);
  local_18c = SUB84(dVar9,0);
  dVar9 = std::cos((double)(ulong)(uint)(fVar4 / 3.0));
  local_190 = SUB84(dVar9,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_188,"angle.cos()","std::cos( pi/3 )",&local_18c,&local_190);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&gtest_ar.message_,__x_06);
  local_1b4 = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)(fVar4 / 3.0));
  local_1b8 = SUB84(dVar9,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_1b0,"angle.sin()","std::sin( pi/3 )",&local_1b4,&local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  fVar5 = qclab::QAngle<float>::theta((QAngle<float> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1d8,"angle.theta()","pi/3","tol",(double)fVar5,(double)(fVar4 / 3.0),
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_1f9 = qclab::QAngle<float>::operator!=
                        ((QAngle<float> *)&gtest_ar.message_,(QAngle<float> *)&gtest_ar_3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1f8,
               (AssertionResult *)"angle != new_angle","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_241 = qclab::QAngle<float>::operator==
                        ((QAngle<float> *)&gtest_ar.message_,(QAngle<float> *)&gtest_ar_3.message_);
  local_241 = !local_241;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar2) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_240,
               (AssertionResult *)"angle == new_angle","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  qclab::QAngle<float>::update
            ((QAngle<float> *)&gtest_ar_3.message_,(QAngle<float> *)&gtest_ar.message_);
  local_289 = qclab::QAngle<float>::operator==
                        ((QAngle<float> *)&gtest_ar.message_,(QAngle<float> *)&gtest_ar_3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_288,
               (AssertionResult *)"angle == new_angle","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2d1 = qclab::QAngle<float>::operator!=
                        ((QAngle<float> *)&gtest_ar.message_,(QAngle<float> *)&gtest_ar_3.message_);
  local_2d1 = !local_2d1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&cos,(internal *)local_2d0,(AssertionResult *)"angle != new_angle","true",
               "false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&cos);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  dVar9 = std::cos(5.26354424712089e-315);
  dVar10 = std::sin(5.26354424712089e-315);
  pQVar1 = (QAngle<float> *)
           ((long)&gtest_ar_12.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 4);
  qclab::QAngle<float>::QAngle(pQVar1,1.0);
  dVar11 = qclab::QAngle<float>::cos(pQVar1,__x_07);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_330,"angle.cos()","cos","tol",(double)SUB84(dVar11,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar2) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  dVar9 = qclab::QAngle<float>::sin
                    ((QAngle<float> *)
                     ((long)&gtest_ar_12.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),__x_08);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_350,"angle.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)SUB84(dVar10,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar2) {
    testing::Message::Message(&local_358);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  fVar5 = qclab::QAngle<float>::theta
                    ((QAngle<float> *)
                     ((long)&gtest_ar_12.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_370,"angle.theta()","theta","tol",(double)fVar5,1.0,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos_1,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos_1);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  fVar5 = fVar4 * 0.5;
  dVar9 = std::cos((double)(ulong)(uint)fVar5);
  dVar10 = std::sin((double)(ulong)(uint)fVar5);
  pQVar1 = (QAngle<float> *)
           ((long)&gtest_ar_15.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 4);
  qclab::QAngle<float>::QAngle(pQVar1,fVar5);
  dVar11 = qclab::QAngle<float>::cos(pQVar1,__x_09);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3a8,"angle.cos()","cos","tol",(double)SUB84(dVar11,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar2) {
    testing::Message::Message(&local_3b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  dVar9 = qclab::QAngle<float>::sin
                    ((QAngle<float> *)
                     ((long)&gtest_ar_15.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),__x_10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3c8,"angle.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)SUB84(dVar10,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar2) {
    testing::Message::Message(&local_3d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  fVar6 = qclab::QAngle<float>::theta
                    ((QAngle<float> *)
                     ((long)&gtest_ar_15.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_3e8,"angle.theta()","theta","tol",(double)fVar6,(double)fVar5,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar2) {
    testing::Message::Message(&local_3f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos_2,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos_2);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  dVar9 = std::cos(5.2220990168286e-315);
  dVar10 = std::sin(5.2220990168286e-315);
  pQVar1 = (QAngle<float> *)
           ((long)&gtest_ar_18.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 4);
  qclab::QAngle<float>::QAngle(pQVar1,SUB84(dVar9,0),SUB84(dVar10,0));
  dVar11 = qclab::QAngle<float>::cos(pQVar1,__x_11);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_420,"angle.cos()","cos","tol",(double)SUB84(dVar11,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_428);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  dVar9 = qclab::QAngle<float>::sin
                    ((QAngle<float> *)
                     ((long)&gtest_ar_18.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),__x_12);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_440,"angle.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)SUB84(dVar10,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar2) {
    testing::Message::Message(&local_448);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  fVar5 = qclab::QAngle<float>::theta
                    ((QAngle<float> *)
                     ((long)&gtest_ar_18.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_460,"angle.theta()","theta","tol",(double)fVar5,0.5,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar2) {
    testing::Message::Message(&local_468);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos_3,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos_3);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  fVar5 = fVar4 * 0.25;
  dVar9 = std::cos((double)(ulong)(uint)fVar5);
  angle_4.sin_ = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)fVar5);
  angle_4.cos_ = SUB84(dVar9,0);
  pQVar1 = (QAngle<float> *)
           ((long)&gtest_ar_21.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 4);
  qclab::QAngle<float>::QAngle(pQVar1,angle_4.sin_,angle_4.cos_);
  dVar9 = qclab::QAngle<float>::cos(pQVar1,__x_13);
  local_49c = SUB84(dVar9,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_498,"angle.cos()","cos",&local_49c,&angle_4.sin_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar2) {
    testing::Message::Message(&local_4a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  dVar9 = qclab::QAngle<float>::sin
                    ((QAngle<float> *)
                     ((long)&gtest_ar_21.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),__x_14);
  local_4c4 = SUB84(dVar9,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_4c0,"angle.sin()","sin",&local_4c4,&angle_4.cos_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar2) {
    testing::Message::Message(&local_4d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  fVar6 = qclab::QAngle<float>::theta
                    ((QAngle<float> *)
                     ((long)&gtest_ar_21.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4e8,"angle.theta()","theta","tol",(double)fVar6,(double)fVar5,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar2) {
    testing::Message::Message(&local_4f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos1,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos1);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  fVar6 = fVar4 * 0.5;
  dVar9 = std::cos((double)(ulong)(uint)fVar6);
  angle1.sin_ = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)fVar6);
  angle1.cos_ = SUB84(dVar9,0);
  qclab::QAngle<float>::QAngle((QAngle<float> *)&cos2,fVar6);
  fVar5 = fVar4 / 3.0;
  dVar9 = std::cos((double)(ulong)(uint)fVar5);
  angle2.sin_ = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)fVar5);
  angle2.cos_ = SUB84(dVar9,0);
  qclab::QAngle<float>::QAngle((QAngle<float> *)&cos_4,fVar5);
  qclab::QAngle<float>::operator+=((QAngle<float> *)&cos2,(QAngle<float> *)&cos_4);
  fVar6 = fVar6 + fVar5;
  dVar9 = std::cos((double)(ulong)(uint)fVar6);
  dVar10 = std::sin((double)(ulong)(uint)fVar6);
  gtest_ar_24.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = SUB84(dVar10,0);
  dVar10 = qclab::QAngle<float>::cos((QAngle<float> *)&cos2,dVar10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_540,"angle1.cos()","cos","tol",(double)SUB84(dVar10,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&cos2,__x_15);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_560,"angle1.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)gtest_ar_24.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar2) {
    testing::Message::Message(&local_568);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  fVar7 = qclab::QAngle<float>::theta((QAngle<float> *)&cos2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_580,"angle1.theta()","theta","tol",(double)fVar7,(double)fVar6,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar2) {
    testing::Message::Message(&local_588);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  dVar9 = qclab::QAngle<float>::cos((QAngle<float> *)&cos_4,__x_16);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_5a0,"angle2.cos()","cos2","tol",(double)SUB84(dVar9,0),
             (double)angle2.sin_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar2) {
    testing::Message::Message(&local_5a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&cos_4,__x_17);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_5c0,"angle2.sin()","sin2","tol",(double)SUB84(dVar9,0),
             (double)angle2.cos_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar2) {
    testing::Message::Message(&local_5c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  fVar6 = qclab::QAngle<float>::theta((QAngle<float> *)&cos_4);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_5e0,"angle2.theta()","theta2","tol",(double)fVar6,(double)fVar5,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar2) {
    testing::Message::Message(&local_5e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos1_1,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos1_1);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  fVar6 = fVar4 * 0.5;
  dVar9 = std::cos((double)(ulong)(uint)fVar6);
  angle1_1.sin_ = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)fVar6);
  angle1_1.cos_ = SUB84(dVar9,0);
  qclab::QAngle<float>::QAngle((QAngle<float> *)&cos2_1,fVar6);
  fVar5 = fVar4 / 3.0;
  dVar9 = std::cos((double)(ulong)(uint)fVar5);
  angle2_1.sin_ = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)fVar5);
  angle2_1.cos_ = SUB84(dVar9,0);
  qclab::QAngle<float>::QAngle((QAngle<float> *)&cos_5,fVar5);
  qclab::QAngle<float>::operator-=((QAngle<float> *)&cos2_1,(QAngle<float> *)&cos_5);
  fVar6 = fVar6 - fVar5;
  dVar9 = std::cos((double)(ulong)(uint)fVar6);
  dVar10 = std::sin((double)(ulong)(uint)fVar6);
  gtest_ar_30.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = SUB84(dVar10,0);
  dVar10 = qclab::QAngle<float>::cos((QAngle<float> *)&cos2_1,dVar10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_638,"angle1.cos()","cos","tol",(double)SUB84(dVar10,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar2) {
    testing::Message::Message(&local_640);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&cos2_1,__x_18);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_658,"angle1.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)gtest_ar_30.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar2) {
    testing::Message::Message(&local_660);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  fVar7 = qclab::QAngle<float>::theta((QAngle<float> *)&cos2_1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_678,"angle1.theta()","theta","tol",(double)fVar7,(double)fVar6,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar2) {
    testing::Message::Message(&local_680);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  dVar9 = qclab::QAngle<float>::cos((QAngle<float> *)&cos_5,__x_19);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_698,"angle2.cos()","cos2","tol",(double)SUB84(dVar9,0),
             (double)angle2_1.sin_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar2) {
    testing::Message::Message(&local_6a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  dVar9 = qclab::QAngle<float>::sin((QAngle<float> *)&cos_5,__x_20);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_6b8,"angle2.sin()","sin2","tol",(double)SUB84(dVar9,0),
             (double)angle2_1.cos_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar2) {
    testing::Message::Message(&local_6c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  fVar6 = qclab::QAngle<float>::theta((QAngle<float> *)&cos_5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_6d8,"angle2.theta()","theta2","tol",(double)fVar6,(double)fVar5,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar2) {
    testing::Message::Message(&local_6e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos1_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos1_2,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos1_2);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  fVar6 = fVar4 * 0.5;
  dVar9 = std::cos((double)(ulong)(uint)fVar6);
  angle1_2.sin_ = SUB84(dVar9,0);
  dVar9 = std::sin((double)(ulong)(uint)fVar6);
  angle1_2.cos_ = SUB84(dVar9,0);
  qclab::QAngle<float>::QAngle((QAngle<float> *)&cos2_2,fVar6);
  fVar4 = fVar4 / 3.0;
  std::cos((double)(ulong)(uint)fVar4);
  std::sin((double)(ulong)(uint)fVar4);
  qclab::QAngle<float>::QAngle(&sum,fVar4);
  local_718 = qclab::operator+(_cos2_2,&sum);
  fVar5 = fVar6 + fVar4;
  dVar9 = std::cos((double)(ulong)(uint)fVar5);
  dVar10 = std::sin((double)(ulong)(uint)fVar5);
  gtest_ar_36.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = SUB84(dVar10,0);
  dVar10 = qclab::QAngle<float>::cos(&local_718,dVar10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_740,"sum.cos()","cos","tol",(double)SUB84(dVar10,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar2) {
    testing::Message::Message(&local_748);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  dVar9 = qclab::QAngle<float>::sin(&local_718,__x_21);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_760,"sum.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)gtest_ar_36.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar2) {
    testing::Message::Message(&local_768);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  fVar7 = qclab::QAngle<float>::theta(&local_718);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_780,"sum.theta()","theta","tol",(double)fVar7,(double)fVar5,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar2) {
    testing::Message::Message(&local_788);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&minus,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&minus,&local_788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minus);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  gtest_ar_39.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_cos2_2;
  local_798 = qclab::operator-(_cos2_2,&sum);
  fVar6 = fVar6 - fVar4;
  dVar9 = std::cos((double)(ulong)(uint)fVar6);
  dVar10 = std::sin((double)(ulong)(uint)fVar6);
  gtest_ar_36.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = SUB84(dVar10,0);
  dVar10 = qclab::QAngle<float>::cos(&local_798,dVar10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_7b0,"minus.cos()","cos","tol",(double)SUB84(dVar10,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar2) {
    testing::Message::Message(&local_7b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  dVar9 = qclab::QAngle<float>::sin(&local_798,__x_22);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_7d0,"minus.sin()","sin","tol",(double)SUB84(dVar9,0),
             (double)gtest_ar_36.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar2) {
    testing::Message::Message(&local_7d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  fVar4 = qclab::QAngle<float>::theta(&local_798);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_7f0,"minus.theta()","theta","tol",(double)fVar4,(double)fVar6,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar2) {
    testing::Message::Message(&local_7f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos_7,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos_7);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  dVar9 = std::cos(5.26354424712089e-315);
  dVar10 = std::sin(5.26354424712089e-315);
  this = &angle2_3.sin_;
  qclab::QAngle<float>::QAngle((QAngle<float> *)this,1.0);
  qclab::QAngle<float>::QAngle(&local_820);
  gtest_ar_42.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<float>::operator-((QAngle<float> *)this);
  local_820 = (QAngle<float>)
              gtest_ar_42.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
  dVar11 = qclab::QAngle<float>::cos
                     ((QAngle<float> *)this,
                      (double)gtest_ar_42.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_838,"angle1.cos()","cos","tol",(double)SUB84(dVar11,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar2) {
    testing::Message::Message(&local_840);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_838);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_840);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  dVar11 = qclab::QAngle<float>::sin((QAngle<float> *)&angle2_3.sin_,__x_23);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_858,"angle1.sin()","sin","tol",(double)SUB84(dVar11,0),
             (double)SUB84(dVar10,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar2) {
    testing::Message::Message(&local_860);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  fVar4 = qclab::QAngle<float>::theta((QAngle<float> *)&angle2_3.sin_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_878,"angle1.theta()","theta","tol",(double)fVar4,1.0,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar2) {
    testing::Message::Message(&local_880);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_880);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  dVar11 = qclab::QAngle<float>::cos(&local_820,__x_24);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_898,"angle2.cos()","cos","tol",(double)SUB84(dVar11,0),
             (double)SUB84(dVar9,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar2) {
    testing::Message::Message(&local_8a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  dVar9 = qclab::QAngle<float>::sin(&local_820,__x_25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_8b8,"angle2.sin()","-sin","tol",(double)SUB84(dVar9,0),
             (double)-SUB84(dVar10,0),1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar2) {
    testing::Message::Message(&local_8c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  fVar4 = qclab::QAngle<float>::theta(&local_820);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_8d8,"angle2.theta()","-theta","tol",(double)fVar4,-1.0,
             1.1920928955078125e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar2) {
    testing::Message::Message(&local_8e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8e8,&local_8e0);
    testing::internal::AssertHelper::~AssertHelper(&local_8e8);
    testing::Message::~Message(&local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  return;
}

Assistant:

void test_qclab_QAngle() {

  const T pi = 4 * std::atan(1) ;
  const T tol = 10 * std::numeric_limits< T >::epsilon() ;

  {
    qclab::QAngle< T >  angle ;

    EXPECT_EQ( angle.cos() , 1 ) ;    // cos
    EXPECT_EQ( angle.sin() , 0 ) ;    // sin
    EXPECT_EQ( angle.theta() , 0 ) ;  // theta

    // update(angle)
    qclab::QAngle< T >  new_angle( 1 ) ;
    angle.update( new_angle ) ;
    EXPECT_NEAR( angle.cos() , std::cos( 1 ) , tol ) ;
    EXPECT_NEAR( angle.sin() , std::sin( 1 ) , tol ) ;
    EXPECT_NEAR( angle.theta() , 1 , tol ) ;

    // update(theta)
    angle.update( pi/2 ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/2 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/2 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/2 , tol ) ;

    // update(cos,sin)
    angle.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/3 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/3 , tol ) ;

    // operators == and !=
    EXPECT_TRUE( angle != new_angle ) ;
    EXPECT_FALSE( angle == new_angle ) ;
    new_angle.update( angle ) ;
    EXPECT_TRUE( angle == new_angle ) ;
    EXPECT_FALSE( angle != new_angle ) ;
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/2 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 0.5 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/4 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_EQ( angle.cos() , cos ) ;              // cos
    EXPECT_EQ( angle.sin() , sin ) ;              // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +=
    angle1 += angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator -=
    angle1 -= angle2 ;
    T theta = theta1 - theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +
    qclab::QAngle< T > sum = angle1 + angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( sum.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( sum.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( sum.theta() , theta , tol ) ;  // theta

    // operator -
    qclab::QAngle< T > minus = angle1 - angle2 ;
    theta = theta1 - theta2 ;
    cos = std::cos( theta ) ;
    sin = std::sin( theta ) ;
    EXPECT_NEAR( minus.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( minus.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( minus.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle1( theta ) ;
    qclab::QAngle< T >  angle2 ;

    // operator -
    angle2 = -angle1 ;
    EXPECT_NEAR( angle1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , -theta , tol ) ;  // theta
  }

}